

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadRefType(BinaryReader *this,Type *out_value,char *desc)

{
  Result RVar1;
  Enum EVar2;
  uint uVar3;
  
  RVar1 = ReadType(this,out_value,desc);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    uVar3 = out_value->enum_ + 0x17;
    if ((7 < uVar3) || (EVar2 = Ok, (0xc5U >> (uVar3 & 0x1f) & 1) == 0)) {
      PrintError(this,"%s must be a reference type",desc);
      EVar2 = Error;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadRefType(Type* out_value, const char* desc) {
  CHECK_RESULT(ReadType(out_value, desc));
  ERROR_UNLESS(out_value->IsRef(), "%s must be a reference type", desc);
  return Result::Ok;
}